

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  ma_uint64 iSample;
  ulong uVar5;
  ma_uint64 mVar6;
  size_t sVar7;
  ma_uint64 iSample_2;
  ulong __n;
  long lVar8;
  ulong uVar9;
  ma_uint8 temp [4096];
  undefined1 local_1038 [4104];
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    uVar5 = 0;
  }
  else {
    uVar1 = pWav->channels;
    uVar2 = pWav->bitsPerSample;
    if ((uVar2 & 7) == 0) {
      uVar4 = (uint)(pWav->fmt).channels * (uint)uVar2 >> 3;
    }
    else {
      uVar4 = (uint)(pWav->fmt).blockAlign;
    }
    if (((pWav->translatedFormatTag & 0xfffe) != 6) || (uVar9 = 0, uVar4 == (pWav->fmt).channels)) {
      uVar9 = (ulong)uVar4;
    }
    uVar5 = 0;
    uVar3 = uVar9 / uVar1;
    if ((uint)uVar1 <= (uint)uVar9) {
      uVar9 = (ulong)uVar2 * uVar1 * framesToWrite;
      if (uVar9 < 8) {
LAB_00154fd4:
        lVar8 = 0;
      }
      else {
        uVar9 = uVar9 >> 3;
        uVar5 = uVar3 * (0x1000 / uVar3);
        uVar4 = (uint)uVar3 - 2;
        lVar8 = 0;
        do {
          __n = uVar5;
          if (uVar9 < uVar5) {
            __n = uVar9;
          }
          memcpy(local_1038,pData,__n);
          if (uVar4 < 7) {
            mVar6 = (*(code *)(&DAT_0017aa9c + *(int *)(&DAT_0017aa9c + (ulong)uVar4 * 4)))();
            return mVar6;
          }
          if (0x1000 < (uint)uVar3) goto LAB_00154fd4;
          sVar7 = (*pWav->onWrite)(pWav->pUserData,local_1038,__n);
          pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar7;
          if (sVar7 == 0) break;
          lVar8 = lVar8 + sVar7;
          pData = (void *)((long)pData + sVar7);
          uVar9 = uVar9 - sVar7;
        } while (uVar9 != 0);
      }
      uVar5 = ((ulong)(lVar8 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
    }
  }
  return uVar5;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    ma_uint32 bytesPerSample;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    bytesPerSample = ma_dr_wav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    if (bytesPerSample == 0) {
        return 0;
    }
    while (bytesToWrite > 0) {
        ma_uint8 temp[4096];
        ma_uint32 sampleCount;
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        sampleCount = sizeof(temp)/bytesPerSample;
        if (bytesToWriteThisIteration > ((ma_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((ma_uint64)sampleCount)*bytesPerSample;
        }
        MA_DR_WAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        ma_dr_wav__bswap_samples(temp, sampleCount, bytesPerSample);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}